

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

bool __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
AllocatorsAreEmpty(HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this)

{
  FreeObject *pFVar1;
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this_00;
  
  this_00 = &this->allocatorHead;
  while ((this_00->heapBlock == (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0 &&
         (pFVar1 = SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
                   ::GetExplicitFreeList(this_00), pFVar1 == (FreeObject *)0x0))) {
    this_00 = this_00->next;
    if (this_00 == &this->allocatorHead) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
HeapBucketT<TBlockType>::AllocatorsAreEmpty() const
{
    TBlockAllocatorType const * current = &allocatorHead;
    do
    {
        if (current->GetHeapBlock() != nullptr || current->GetExplicitFreeList() != nullptr)
        {
            return false;
        }
        current = current->GetNext();
    }
    while (current != &allocatorHead);
    return true;
}